

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

gba_ppu_t * init_ppu(_Bool enable_graphics)

{
  gba_ppu_t *__s;
  byte in_DIL;
  int x;
  gba_ppu_t *ppu;
  int x_1;
  uint16_t *warr;
  int local_34;
  int local_24;
  
  __s = (gba_ppu_t *)malloc(0x3ecd4);
  memset(__s,0,0x3ecd4);
  __s->enable_graphics = (_Bool)(in_DIL & 1);
  for (local_34 = 0; local_34 < 0xf0; local_34 = local_34 + 1) {
    __s->bgbuf[0][local_34].raw = __s->bgbuf[0][local_34].raw & 0x7fff | 0x8000;
    __s->bgbuf[1][local_34].raw = __s->bgbuf[1][local_34].raw & 0x7fff | 0x8000;
    __s->bgbuf[2][local_34].raw = __s->bgbuf[2][local_34].raw & 0x7fff | 0x8000;
    __s->bgbuf[3][local_34].raw = __s->bgbuf[3][local_34].raw & 0x7fff | 0x8000;
  }
  for (local_24 = 0; local_24 < 0xf0; local_24 = local_24 + 1) {
    __s->obj_priorities[local_24] = '\0';
    __s->obj_window[local_24] = false;
    __s->objbuf[local_24] = *(gba_color_t *)__s->pram;
    __s->objbuf[local_24].raw = __s->objbuf[local_24].raw & 0x7fff | 0x8000;
  }
  (__s->BG2PA).raw = 0x100;
  (__s->BG2PB).raw = 0;
  (__s->BG2PC).raw = 0;
  (__s->BG2PA).raw = 0x100;
  (__s->BG3PA).raw = 0x100;
  (__s->BG3PB).raw = 0;
  (__s->BG3PC).raw = 0;
  (__s->BG3PA).raw = 0x100;
  return __s;
}

Assistant:

gba_ppu_t* init_ppu(bool enable_graphics) {
    assert(sizeof(float) == sizeof(word));

    gba_ppu_t* ppu = malloc(sizeof(gba_ppu_t));
    memset(ppu, 0, sizeof(gba_ppu_t));

    ppu->enable_graphics = enable_graphics;

    for (int x = 0; x < GBA_SCREEN_X; x++) {
        ppu->bgbuf[0][x].transparent = true;
        ppu->bgbuf[1][x].transparent = true;
        ppu->bgbuf[2][x].transparent = true;
        ppu->bgbuf[3][x].transparent = true;
    }

    clear_obj(ppu);

    ppu->BG2PA.raw = 0x0100;
    ppu->BG2PB.raw = 0x0000;
    ppu->BG2PC.raw = 0x0000;
    ppu->BG2PA.raw = 0x0100;

    ppu->BG3PA.raw = 0x0100;
    ppu->BG3PB.raw = 0x0000;
    ppu->BG3PC.raw = 0x0000;
    ppu->BG3PA.raw = 0x0100;

    return ppu;
}